

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_test.cc
# Opt level: O1

void __thiscall leveldb::TestState::Change(TestState *this,ReaderState s)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mu_);
  if (iVar1 == 0) {
    this->state_ = s;
    std::condition_variable::notify_one();
    pthread_mutex_unlock((pthread_mutex_t *)&this->mu_);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

LOCKS_EXCLUDED(mu_) {
    mu_.Lock();
    state_ = s;
    state_cv_.Signal();
    mu_.Unlock();
  }